

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

LIBSSH2_LISTENER *
channel_forward_listen
          (LIBSSH2_SESSION *session,char *host,int port,int *bound_port,int queue_maxsize)

{
  uint32_t uVar1;
  size_t sVar2;
  uchar *puVar3;
  char *pcVar4;
  LIBSSH2_LISTENER *local_60;
  LIBSSH2_LISTENER *listener;
  size_t data_len;
  uchar *data;
  uchar *puStack_40;
  int rc;
  uchar *s;
  int *piStack_30;
  int queue_maxsize_local;
  int *bound_port_local;
  char *pcStack_20;
  int port_local;
  char *host_local;
  LIBSSH2_SESSION *session_local;
  
  pcStack_20 = host;
  if (host == (char *)0x0) {
    pcStack_20 = "0.0.0.0";
  }
  s._4_4_ = queue_maxsize;
  piStack_30 = bound_port;
  bound_port_local._4_4_ = port;
  host_local = (char *)session;
  if (session->fwdLstn_state == libssh2_NB_state_idle) {
    sVar2 = strlen(pcStack_20);
    *(int *)(host_local + 0x11b48) = (int)sVar2;
    *(int *)(host_local + 0x11b4c) = *(int *)(host_local + 0x11b48) + 0x1b;
    memset(host_local + 0x11b50,0,8);
    puVar3 = (uchar *)(**(code **)(host_local + 8))
                                (*(undefined4 *)(host_local + 0x11b4c),host_local);
    *(uchar **)(host_local + 0x11b40) = puVar3;
    if (*(long *)(host_local + 0x11b40) == 0) {
      puStack_40 = puVar3;
      _libssh2_error((LIBSSH2_SESSION *)host_local,-6,"Unable to allocate memory for setenv packet")
      ;
      return (LIBSSH2_LISTENER *)0x0;
    }
    puStack_40 = puVar3 + 1;
    *puVar3 = 'P';
    _libssh2_store_str(&stack0xffffffffffffffc0,"tcpip-forward",0xd);
    *puStack_40 = '\x01';
    puStack_40 = puStack_40 + 1;
    _libssh2_store_str(&stack0xffffffffffffffc0,pcStack_20,(ulong)*(uint *)(host_local + 0x11b48));
    _libssh2_store_u32(&stack0xffffffffffffffc0,bound_port_local._4_4_);
    host_local[0x11b38] = '\x02';
    host_local[0x11b39] = '\0';
    host_local[0x11b3a] = '\0';
    host_local[0x11b3b] = '\0';
  }
  if (*(int *)(host_local + 0x11b38) == 2) {
    data._4_4_ = _libssh2_transport_send
                           ((LIBSSH2_SESSION *)host_local,*(uchar **)(host_local + 0x11b40),
                            (ulong)*(uint *)(host_local + 0x11b4c),(uchar *)0x0,0);
    if (data._4_4_ == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)host_local,-0x25,
                     "Would block sending global-request packet for forward listen request");
      return (LIBSSH2_LISTENER *)0x0;
    }
    if (data._4_4_ != 0) {
      _libssh2_error((LIBSSH2_SESSION *)host_local,-7,
                     "Unable to send global-request packet for forward listen request");
      (**(code **)(host_local + 0x18))(*(undefined8 *)(host_local + 0x11b40),host_local);
      host_local[0x11b40] = '\0';
      host_local[0x11b41] = '\0';
      host_local[0x11b42] = '\0';
      host_local[0x11b43] = '\0';
      host_local[0x11b44] = '\0';
      host_local[0x11b45] = '\0';
      host_local[0x11b46] = '\0';
      host_local[0x11b47] = '\0';
      host_local[0x11b38] = '\0';
      host_local[0x11b39] = '\0';
      host_local[0x11b3a] = '\0';
      host_local[0x11b3b] = '\0';
      return (LIBSSH2_LISTENER *)0x0;
    }
    (**(code **)(host_local + 0x18))(*(undefined8 *)(host_local + 0x11b40),host_local);
    host_local[0x11b40] = '\0';
    host_local[0x11b41] = '\0';
    host_local[0x11b42] = '\0';
    host_local[0x11b43] = '\0';
    host_local[0x11b44] = '\0';
    host_local[0x11b45] = '\0';
    host_local[0x11b46] = '\0';
    host_local[0x11b47] = '\0';
    host_local[0x11b38] = '\x03';
    host_local[0x11b39] = '\0';
    host_local[0x11b3a] = '\0';
    host_local[0x11b3b] = '\0';
  }
  if (*(int *)(host_local + 0x11b38) == 3) {
    data._4_4_ = _libssh2_packet_requirev
                           ((LIBSSH2_SESSION *)host_local,"QR",(uchar **)&data_len,
                            (size_t *)&listener,0,(uchar *)0x0,0,
                            (packet_requirev_state_t *)(host_local + 0x11b50));
    if (data._4_4_ == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)host_local,-0x25,"Would block");
      return (LIBSSH2_LISTENER *)0x0;
    }
    if ((data._4_4_ != 0) || (listener == (LIBSSH2_LISTENER *)0x0)) {
      _libssh2_error((LIBSSH2_SESSION *)host_local,-0xe,"Unknown");
      host_local[0x11b38] = '\0';
      host_local[0x11b39] = '\0';
      host_local[0x11b3a] = '\0';
      host_local[0x11b3b] = '\0';
      return (LIBSSH2_LISTENER *)0x0;
    }
    if (*(char *)data_len == 'Q') {
      local_60 = (LIBSSH2_LISTENER *)_libssh2_calloc((LIBSSH2_SESSION *)host_local,0x60);
      if (local_60 == (LIBSSH2_LISTENER *)0x0) {
        _libssh2_error((LIBSSH2_SESSION *)host_local,-6,
                       "Unable to allocate memory for listener queue");
      }
      else {
        pcVar4 = (char *)(**(code **)(host_local + 8))
                                   (*(int *)(host_local + 0x11b48) + 1,host_local);
        local_60->host = pcVar4;
        if (local_60->host == (char *)0x0) {
          _libssh2_error((LIBSSH2_SESSION *)host_local,-6,
                         "Unable to allocate memory for listener queue");
          (**(code **)(host_local + 0x18))(local_60,host_local);
          local_60 = (LIBSSH2_LISTENER *)0x0;
        }
        else {
          local_60->session = (LIBSSH2_SESSION *)host_local;
          memcpy(local_60->host,pcStack_20,(ulong)*(uint *)(host_local + 0x11b48));
          local_60->host[*(uint *)(host_local + 0x11b48)] = '\0';
          if ((listener < (LIBSSH2_LISTENER *)0x5) || (bound_port_local._4_4_ != 0)) {
            local_60->port = bound_port_local._4_4_;
          }
          else {
            uVar1 = _libssh2_ntohu32((uchar *)(data_len + 1));
            local_60->port = uVar1;
          }
          local_60->queue_size = 0;
          local_60->queue_maxsize = s._4_4_;
          _libssh2_list_add((list_head *)(host_local + 0x248),(list_node *)local_60);
          if (piStack_30 != (int *)0x0) {
            *piStack_30 = local_60->port;
          }
        }
      }
      (**(code **)(host_local + 0x18))(data_len,host_local);
      host_local[0x11b38] = '\0';
      host_local[0x11b39] = '\0';
      host_local[0x11b3a] = '\0';
      host_local[0x11b3b] = '\0';
      return local_60;
    }
    if (*(char *)data_len == 'R') {
      (**(code **)(host_local + 0x18))(data_len,host_local);
      _libssh2_error((LIBSSH2_SESSION *)host_local,-0x20,
                     "Unable to complete request for forward-listen");
      host_local[0x11b38] = '\0';
      host_local[0x11b39] = '\0';
      host_local[0x11b3a] = '\0';
      host_local[0x11b3b] = '\0';
      return (LIBSSH2_LISTENER *)0x0;
    }
  }
  host_local[0x11b38] = '\0';
  host_local[0x11b39] = '\0';
  host_local[0x11b3a] = '\0';
  host_local[0x11b3b] = '\0';
  return (LIBSSH2_LISTENER *)0x0;
}

Assistant:

static LIBSSH2_LISTENER *
channel_forward_listen(LIBSSH2_SESSION * session, const char *host,
                       int port, int *bound_port, int queue_maxsize)
{
    unsigned char *s;
    static const unsigned char reply_codes[3] =
        { SSH_MSG_REQUEST_SUCCESS, SSH_MSG_REQUEST_FAILURE, 0 };
    int rc;

    if(!host)
        host = "0.0.0.0";

    if(session->fwdLstn_state == libssh2_NB_state_idle) {
        session->fwdLstn_host_len = (uint32_t)strlen(host);
        /* 14 = packet_type(1) + request_len(4) + want_replay(1) + host_len(4)
           + port(4) */
        session->fwdLstn_packet_len =
            session->fwdLstn_host_len +
            (uint32_t)(sizeof("tcpip-forward") - 1) + 14;

        /* Zero the whole thing out */
        memset(&session->fwdLstn_packet_requirev_state, 0,
               sizeof(session->fwdLstn_packet_requirev_state));

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Requesting tcpip-forward session for %s:%d", host,
                       port));

        s = session->fwdLstn_packet =
            LIBSSH2_ALLOC(session, session->fwdLstn_packet_len);
        if(!session->fwdLstn_packet) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for setenv packet");
            return NULL;
        }

        *(s++) = SSH_MSG_GLOBAL_REQUEST;
        _libssh2_store_str(&s, "tcpip-forward", sizeof("tcpip-forward") - 1);
        *(s++) = 0x01;          /* want_reply */

        _libssh2_store_str(&s, host, session->fwdLstn_host_len);
        _libssh2_store_u32(&s, port);

        session->fwdLstn_state = libssh2_NB_state_created;
    }

    if(session->fwdLstn_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session,
                                     session->fwdLstn_packet,
                                     session->fwdLstn_packet_len,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending global-request packet for "
                           "forward listen request");
            return NULL;
        }
        else if(rc) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                           "Unable to send global-request packet for forward "
                           "listen request");
            LIBSSH2_FREE(session, session->fwdLstn_packet);
            session->fwdLstn_packet = NULL;
            session->fwdLstn_state = libssh2_NB_state_idle;
            return NULL;
        }
        LIBSSH2_FREE(session, session->fwdLstn_packet);
        session->fwdLstn_packet = NULL;

        session->fwdLstn_state = libssh2_NB_state_sent;
    }

    if(session->fwdLstn_state == libssh2_NB_state_sent) {
        unsigned char *data;
        size_t data_len;
        rc = _libssh2_packet_requirev(session, reply_codes, &data, &data_len,
                                      0, NULL, 0,
                                      &session->fwdLstn_packet_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN, "Would block");
            return NULL;
        }
        else if(rc || (data_len < 1)) {
            _libssh2_error(session, LIBSSH2_ERROR_PROTO, "Unknown");
            session->fwdLstn_state = libssh2_NB_state_idle;
            return NULL;
        }

        if(data[0] == SSH_MSG_REQUEST_SUCCESS) {
            LIBSSH2_LISTENER *listener;

            listener = LIBSSH2_CALLOC(session, sizeof(LIBSSH2_LISTENER));
            if(!listener)
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                               "Unable to allocate memory for listener queue");
            else {
                listener->host =
                    LIBSSH2_ALLOC(session, session->fwdLstn_host_len + 1);
                if(!listener->host) {
                    _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                   "Unable to allocate memory "
                                   "for listener queue");
                    LIBSSH2_FREE(session, listener);
                    listener = NULL;
                }
                else {
                    listener->session = session;
                    memcpy(listener->host, host, session->fwdLstn_host_len);
                    listener->host[session->fwdLstn_host_len] = 0;
                    if(data_len >= 5 && !port) {
                        listener->port = _libssh2_ntohu32(data + 1);
                        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                                       "Dynamic tcpip-forward port "
                                       "allocated: %d",
                                       listener->port));
                    }
                    else
                        listener->port = port;

                    listener->queue_size = 0;
                    listener->queue_maxsize = queue_maxsize;

                    /* append this to the parent's list of listeners */
                    _libssh2_list_add(&session->listeners, &listener->node);

                    if(bound_port) {
                        *bound_port = listener->port;
                    }
                }
            }

            LIBSSH2_FREE(session, data);
            session->fwdLstn_state = libssh2_NB_state_idle;
            return listener;
        }
        else if(data[0] == SSH_MSG_REQUEST_FAILURE) {
            LIBSSH2_FREE(session, data);
            _libssh2_error(session, LIBSSH2_ERROR_REQUEST_DENIED,
                           "Unable to complete request for forward-listen");
            session->fwdLstn_state = libssh2_NB_state_idle;
            return NULL;
        }
    }

    session->fwdLstn_state = libssh2_NB_state_idle;

    return NULL;
}